

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

void __thiscall
Catch::
Optional<Catch::BenchmarkStats<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>::
Optional(Optional<Catch::BenchmarkStats<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
         *this,BenchmarkStats<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *_value)

{
  BenchmarkStats<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *_value_local;
  Optional<Catch::BenchmarkStats<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
  *this_local;
  
  BenchmarkStats<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>::BenchmarkStats
            ((BenchmarkStats<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *)
             this->storage,_value);
  this->nullableValue =
       (BenchmarkStats<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *)this->storage
  ;
  return;
}

Assistant:

Optional( T const& _value ):
            nullableValue( new ( storage ) T( _value ) ) {}